

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
* Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *__return_storage_ptr__,
            vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *v1,vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *v2)

{
  long lVar1;
  pointer pTVar2;
  pointer __first;
  pointer __last;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *this;
  pointer __result;
  pointer pTVar6;
  pointer pTVar7;
  pointer __alloc;
  char *extraout_RDX;
  size_t __n;
  char *extraout_RDX_00;
  char *__s;
  pointer __p;
  Tracker *arg;
  pointer pTVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __p = (pointer)(((long)(v2->
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(v2->
                         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4) +
                 ((long)(v1->
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(v1->
                        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4));
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(v1,(size_type)__p);
  pTVar2 = (v2->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __s = extraout_RDX;
  for (pTVar8 = (v2->
                super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                )._M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar2; pTVar8 = pTVar8 + 1) {
    pTVar7 = (v1->
             super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar7 == (v1->
                  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this = (_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)std::
                vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                ::_M_check_len(v1,(size_type)__p,__s);
      __first = (v1->
                super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __last = (v1->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      __alloc = __last;
      __result = std::
                 _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 ::_M_allocate(this,(size_t)__p);
      *(Tracker **)((long)__result + ((long)pTVar7 - (long)__first)) = pTVar8->origin;
      *(int *)((long)__result + ((long)pTVar7 - (long)__first) + 8) = pTVar8->copies + 1;
      pTVar6 = std::
               vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               ::_S_relocate(__first,pTVar7,__result,(_Tp_alloc_type *)__alloc);
      pTVar7 = std::
               vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               ::_S_relocate(pTVar7,__last,pTVar6 + 1,(_Tp_alloc_type *)__alloc);
      __p = (pointer)((long)(v1->
                            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first >> 4
                     );
      std::
      _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      ::_M_deallocate((_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                       *)__first,__p,__n);
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_start = __result;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this;
      __s = extraout_RDX_00;
    }
    else {
      pTVar7->origin = pTVar8->origin;
      pTVar7->copies = pTVar8->copies + 1;
      pTVar7 = pTVar7 + 1;
    }
    (v1->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_finish = pTVar7;
  }
  uVar3 = *(undefined4 *)
           ((long)&(v1->
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
  uVar4 = *(undefined4 *)
           &(v1->
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = *(undefined4 *)
           ((long)&(v1->
                   super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                   )._M_impl.super__Vector_impl_data._M_finish + 4);
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_start =
       *(undefined4 *)
        &(v1->
         super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
         )._M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_start + 4) = uVar3;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_finish = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_finish + 4) = uVar5;
  (__return_storage_ptr__->
  super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (v1->
       super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (v1->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (v1->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (v1->
    super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline V Cat(V v1, const V& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (const auto& arg : v2) {
        v1.push_back(arg);
    }
    return v1;
}